

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span-main.t.hpp
# Opt level: O3

ostream * nonstd::span_lite::operator<<(ostream *os,span<int,_18446744073709551615UL> *v)

{
  size_type sVar1;
  string_maker<int> *this;
  ostream *poVar2;
  int *value;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68 [16];
  string local_58;
  char *local_38;
  long local_30;
  char local_28 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[span:",6);
  sVar1 = v->size_;
  if (sVar1 == 0) {
    local_78 = local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"[empty]","");
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_78,local_78 + local_70);
    local_38 = local_28;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,local_58._M_dataplus._M_p,
               local_58._M_dataplus._M_p + local_58._M_string_length);
  }
  else {
    this = (string_maker<int> *)span<int,_18446744073709551615UL>::operator[](v,0);
    lest::string_maker<int>::to_string_abi_cxx11_(&local_58,this,value);
    local_78 = local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,local_58._M_dataplus._M_p,
               local_58._M_dataplus._M_p + local_58._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    local_38 = local_28;
    std::__cxx11::string::_M_construct<char*>((string *)&local_38,local_78,local_78 + local_70);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,local_38,local_30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]",1);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  if ((sVar1 == 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2)) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  return poVar2;
}

Assistant:

inline std::ostream & operator<<( std::ostream & os, span<T> const & v )
{
    using lest::to_string;
    return os << "[span:" << (v.empty() ? "[empty]" : to_string( v[0] ) ) << "]";
}